

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void peparse::IterImpVAString(parsed_pe_conflict *pe,iterVAStr cb,void *cbd)

{
  int iVar1;
  list<peparse::importent,_std::allocator<peparse::importent>_> *plVar2;
  _List_node_base *p_Var3;
  importent i;
  importent local_78;
  
  plVar2 = &pe->internal->imports;
  p_Var3 = (_List_node_base *)plVar2;
  do {
    p_Var3 = (((_List_base<peparse::importent,_std::allocator<peparse::importent>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) {
      return;
    }
    importent::importent(&local_78,(importent *)(p_Var3 + 1));
    iVar1 = (*cb)(cbd,local_78.addr,&local_78.moduleName,&local_78.symbolName);
    importent::~importent(&local_78);
  } while (iVar1 == 0);
  return;
}

Assistant:

void IterImpVAString(parsed_pe *pe, iterVAStr cb, void *cbd) {
  list<importent> &l = pe->internal->imports;

  for (importent i : l) {
    if (cb(cbd, i.addr, i.moduleName, i.symbolName) != 0) {
      break;
    }
  }

  return;
}